

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

_Bool golf_geo_generator_data_get_arg
                (golf_geo_generator_data_t *data,char *name,golf_geo_generator_data_arg_t **arg)

{
  int iVar1;
  int local_2c;
  int i;
  golf_geo_generator_data_arg_t **arg_local;
  char *name_local;
  golf_geo_generator_data_t *data_local;
  
  local_2c = 0;
  while( true ) {
    if ((data->args).length <= local_2c) {
      return false;
    }
    iVar1 = strcmp((data->args).data[local_2c].name,name);
    if (iVar1 == 0) break;
    local_2c = local_2c + 1;
  }
  *arg = (data->args).data + local_2c;
  return true;
}

Assistant:

bool golf_geo_generator_data_get_arg(golf_geo_generator_data_t *data, const char *name, golf_geo_generator_data_arg_t **arg) {
    for (int i = 0; i < data->args.length; i++) {
        if (strcmp(data->args.data[i].name, name) == 0) {
            *arg = &data->args.data[i];
            return true;
        }
    }
    return false;
}